

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_pmeth.c
# Opt level: O2

int pkey_gost2001_paramgen(EVP_PKEY_CTX *ctx,EVP_PKEY *pkey)

{
  int iVar1;
  int *piVar2;
  EC_KEY *eckey;
  
  piVar2 = (int *)EVP_PKEY_CTX_get_data((EVP_PKEY_CTX *)ctx);
  if ((piVar2 == (int *)0x0) || (*piVar2 == 0)) {
    ERR_GOST_error(0x78,0x7a,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_pmeth.c"
                   ,0x17b);
  }
  else {
    eckey = EC_KEY_new();
    iVar1 = fill_GOST_EC_params((EC_KEY *)eckey,*piVar2);
    if ((iVar1 != 0) && (iVar1 = EVP_PKEY_assign((EVP_PKEY *)pkey,0x32b,eckey), iVar1 != 0)) {
      return 1;
    }
    EC_KEY_free(eckey);
  }
  return 0;
}

Assistant:

static int pkey_gost2001_paramgen(EVP_PKEY_CTX *ctx, EVP_PKEY *pkey)
{
    struct gost_pmeth_data *data = EVP_PKEY_CTX_get_data(ctx);
    EC_KEY *ec = NULL;

    if (!data || data->sign_param_nid == NID_undef) {
        GOSTerr(GOST_F_PKEY_GOST2001_PARAMGEN, GOST_R_NO_PARAMETERS_SET);
        return 0;
    }

    ec = EC_KEY_new();
    if (!fill_GOST_EC_params(ec, data->sign_param_nid)
        || !EVP_PKEY_assign(pkey, NID_id_GostR3410_2001, ec)) {
        EC_KEY_free(ec);
        return 0;
    }
    return 1;
}